

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcElementQuantity::~IfcElementQuantity
          (IfcElementQuantity *this,void **vtt)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _func_int **pp_Var2;
  pointer pLVar3;
  undefined1 *puVar4;
  pointer pcVar5;
  undefined1 *puVar6;
  
  pp_Var2 = (_func_int **)*vtt;
  (this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper = pp_Var2;
  *(void **)((long)&(this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot
                    .super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper +
            (long)pp_Var2[-3]) = vtt[0x12];
  *(void **)&(this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.
             field_0x88 = vtt[0x13];
  *(void **)&(this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.
             field_0x98 = vtt[0x14];
  *(void **)&(this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.field_0xa8 =
       vtt[0x15];
  pLVar3 = (this->Quantities).
           super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
           .
           super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pLVar3 != (pointer)0x0) {
    operator_delete(pLVar3,(long)(this->Quantities).
                                 super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
                                 .
                                 super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pLVar3);
  }
  puVar4 = *(undefined1 **)&(this->super_IfcPropertySetDefinition).field_0xb8;
  if (puVar4 != &this->field_0xc8) {
    operator_delete(puVar4,*(long *)&this->field_0xc8 + 1);
  }
  pp_Var2 = (_func_int **)vtt[3];
  (this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper = pp_Var2;
  *(void **)((long)&(this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot
                    .super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper +
            (long)pp_Var2[-3]) = vtt[6];
  pcVar5 = (this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.
           Description.ptr._M_dataplus._M_p;
  paVar1 = &(this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.
            Description.ptr.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  pcVar5 = (this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.Name.ptr
           ._M_dataplus._M_p;
  paVar1 = &(this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.Name.
            ptr.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  puVar4 = *(undefined1 **)
            &(this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.field_0x10;
  puVar6 = &(this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.
            super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.field_0x20;
  if (puVar4 != puVar6) {
    operator_delete(puVar4,*(long *)puVar6 + 1);
    return;
  }
  return;
}

Assistant:

IfcElementQuantity() : Object("IfcElementQuantity") {}